

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

void __thiscall
Glucose::Heap<Glucose::SimpSolver::ElimLt>::percolateDown
          (Heap<Glucose::SimpSolver::ElimLt> *this,int i)

{
  int index;
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int in_ESI;
  long in_RDI;
  int child;
  int x;
  Var in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  vec<int> *in_stack_ffffffffffffffb0;
  undefined4 local_44;
  undefined4 local_c;
  
  piVar4 = vec<int>::operator[]((vec<int> *)(in_RDI + 8),in_ESI);
  index = *piVar4;
  local_c = in_ESI;
  while( true ) {
    iVar2 = left(local_c);
    iVar3 = vec<int>::size((vec<int> *)(in_RDI + 8));
    if (iVar3 <= iVar2) break;
    iVar2 = right(local_c);
    iVar3 = vec<int>::size((vec<int> *)(in_RDI + 8));
    if (iVar2 < iVar3) {
      iVar2 = right(local_c);
      vec<int>::operator[]((vec<int> *)(in_RDI + 8),iVar2);
      iVar2 = left(local_c);
      vec<int>::operator[]((vec<int> *)(in_RDI + 8),iVar2);
      bVar1 = SimpSolver::ElimLt::operator()
                        ((ElimLt *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                         in_stack_ffffffffffffffa8);
      if (!bVar1) goto LAB_0011b14c;
      local_44 = right(local_c);
    }
    else {
LAB_0011b14c:
      local_44 = left(local_c);
    }
    vec<int>::operator[]((vec<int> *)(in_RDI + 8),local_44);
    bVar1 = SimpSolver::ElimLt::operator()
                      ((ElimLt *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                       in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    piVar4 = vec<int>::operator[]((vec<int> *)(in_RDI + 8),local_44);
    in_stack_ffffffffffffffac = *piVar4;
    piVar4 = vec<int>::operator[]((vec<int> *)(in_RDI + 8),local_c);
    *piVar4 = in_stack_ffffffffffffffac;
    in_stack_ffffffffffffffb0 = (vec<int> *)(in_RDI + 0x18);
    piVar4 = vec<int>::operator[]((vec<int> *)(in_RDI + 8),local_c);
    piVar4 = vec<int>::operator[](in_stack_ffffffffffffffb0,*piVar4);
    *piVar4 = local_c;
    local_c = local_44;
  }
  piVar4 = vec<int>::operator[]((vec<int> *)(in_RDI + 8),local_c);
  *piVar4 = index;
  piVar4 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x18),index);
  *piVar4 = local_c;
  return;
}

Assistant:

void percolateDown(int i)
    {
        int x = heap[i];
        while (left(i) < heap.size()){
            int child = right(i) < heap.size() && lt(heap[right(i)], heap[left(i)]) ? right(i) : left(i);
            if (!lt(heap[child], x)) break;
            heap[i]          = heap[child];
            indices[heap[i]] = i;
            i                = child;
        }
        heap   [i] = x;
        indices[x] = i;
    }